

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O2

void __thiscall
Map<unsigned_int,_Error::Private::Str>::~Map(Map<unsigned_int,_Error::Private::Str> *this)

{
  Item *pIVar1;
  ItemBlock *pIVar2;
  ItemBlock *pIVar3;
  Iterator *pIVar4;
  
  pIVar4 = &this->_begin;
  while (pIVar1 = pIVar4->item, pIVar1 != &this->endItem) {
    Error::Private::Str::~Str(&pIVar1->value);
    pIVar4 = (Iterator *)&pIVar1->next;
  }
  pIVar3 = this->blocks;
  while (pIVar3 != (ItemBlock *)0x0) {
    pIVar2 = pIVar3->next;
    operator_delete__(pIVar3);
    pIVar3 = pIVar2;
  }
  Error::Private::Str::~Str(&(this->endItem).value);
  return;
}

Assistant:

~Map()
  {
    for(Item* i = _begin.item, * end = &endItem; i != end; i = i->next)
      i->~Item();
    for(ItemBlock* i = blocks, * next; i; i = next)
    {
      next = i->next;
      delete[] (char*)i;
    }
  }